

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

Vector<const_char> __thiscall
FIX::double_conversion::Vector<const_char>::SubVector(Vector<const_char> *this,int from,int to)

{
  Vector<const_char> VVar1;
  
  if (this->length_ < to) {
    __assert_fail("to <= length_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xb9,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  if (to <= from) {
    __assert_fail("from < to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xba,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  if (from < 0) {
    __assert_fail("0 <= from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xbb,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  VVar1.length_ = to - from;
  if ((VVar1.length_ != 0 && from <= to) && (this->start_ != (char *)0x0)) {
    VVar1.start_ = this->start_ + (uint)from;
    VVar1._12_4_ = 0;
    return VVar1;
  }
  __assert_fail("len == 0 || (len > 0 && data != __null)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xb3,
                "FIX::double_conversion::Vector<const char>::Vector(T *, int) [T = const char]");
}

Assistant:

Vector<T> SubVector(int from, int to) {
    ASSERT(to <= length_);
    ASSERT(from < to);
    ASSERT(0 <= from);
    return Vector<T>(start() + from, to - from);
  }